

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O1

void __thiscall CTcMakeModule::set_module_name(CTcMakeModule *this,textchar_t *modname)

{
  size_t sVar1;
  size_t sVar2;
  textchar_t buf [4096];
  char acStack_1028 [4096];
  
  if ((this->src_).buf_ == (textchar_t *)0x0) {
    sVar1 = strlen(modname);
    sVar2 = 0xfff;
    if (sVar1 < 0xfff) {
      sVar2 = sVar1;
    }
    memcpy(acStack_1028,modname,sVar2);
    acStack_1028[sVar2] = '\0';
    os_defext(acStack_1028,"t");
    CTcMakeStr::set(&this->src_,acStack_1028);
  }
  if ((this->sym_).buf_ == (textchar_t *)0x0) {
    sVar1 = strlen(modname);
    sVar2 = 0xfff;
    if (sVar1 < 0xfff) {
      sVar2 = sVar1;
    }
    memcpy(acStack_1028,modname,sVar2);
    acStack_1028[sVar2] = '\0';
    os_remext(acStack_1028);
    os_addext(acStack_1028,"t3s");
    CTcMakeStr::set(&this->sym_,acStack_1028);
  }
  if ((this->obj_).buf_ == (textchar_t *)0x0) {
    sVar1 = strlen(modname);
    sVar2 = 0xfff;
    if (sVar1 < 0xfff) {
      sVar2 = sVar1;
    }
    memcpy(acStack_1028,modname,sVar2);
    acStack_1028[sVar2] = '\0';
    os_remext(acStack_1028);
    os_addext(acStack_1028,"t3o");
    CTcMakeStr::set(&this->obj_,acStack_1028);
  }
  return;
}

Assistant:

void CTcMakeModule::set_module_name(const textchar_t *modname)
{
    textchar_t buf[OSFNMAX];

    /* set the source name, if it's not already set */
    if (!src_.is_set())
    {
        /* add a default extension of ".t" to make the source name */
        lib_strcpy(buf, sizeof(buf), modname);
        os_defext(buf, "t");
        src_.set(buf);
    }

    /* set the symbol file name, if it's not already set */
    if (!sym_.is_set())
    {
        /* add a default extension of ".t3s" to make the symbol file name */
        lib_strcpy(buf, sizeof(buf), modname);
        os_remext(buf);
        os_addext(buf, "t3s");
        sym_.set(buf);
    }

    /* set the object file name, if it's not already set */
    if (!obj_.is_set())
    {
        /* add a default extension of ".t3o" to make the object name */
        lib_strcpy(buf, sizeof(buf), modname);
        os_remext(buf);
        os_addext(buf, "t3o");
        obj_.set(buf);
    }
}